

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O0

char * string_trim(char *string)

{
  undefined8 local_28;
  long len;
  char *p;
  char *string_local;
  
  len = (long)string;
  if (string == (char *)0x0) {
    string_local = (char *)0x0;
  }
  else {
    for (; *(char *)len == ' '; len = len + 1) {
    }
    for (local_28 = strlen((char *)len); *(char *)(len + (local_28 - 1)) == ' ';
        local_28 = local_28 - 1) {
    }
    *(undefined1 *)(len + local_28) = 0;
    string_local = (char *)len;
  }
  return string_local;
}

Assistant:

static char *string_trim(char *string)
{
    char *p = string;
    long len;

    if (string == NULL)
        return NULL;

    while (*p == ' ')
        p++;

    len = strlen(p);

    while (p[len - 1] == ' ')
        len--;
    p[len] = '\0';

    return p;
}